

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

btScalar __thiscall
btCollisionWorld::
rayTestSingleInternal(btTransform_const&,btTransform_const&,btCollisionObjectWrapper_const*,btCollisionWorld
::RayResultCallback&)::LocalInfoAdder2::addSingleResult(btCollisionWorld::LocalRayResult__bool_
          (void *this,LocalRayResult *r,bool b)

{
  btScalar bVar1;
  LocalShapeInfo shapeInfo;
  LocalShapeInfo local_10;
  
  local_10.m_shapePart = -1;
  local_10.m_triangleIndex = *(int *)((long)this + 0x28);
  if (r->m_localShapeInfo == (LocalShapeInfo *)0x0) {
    r->m_localShapeInfo = &local_10;
  }
  bVar1 = (btScalar)
          (**(code **)(**(long **)((long)this + 0x20) + 0x18))(*(long **)((long)this + 0x20),r,b);
  *(undefined4 *)((long)this + 8) = *(undefined4 *)(*(long *)((long)this + 0x20) + 8);
  return bVar1;
}

Assistant:

virtual btScalar addSingleResult (btCollisionWorld::LocalRayResult &r, bool b)
					{
						btCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = -1;
						shapeInfo.m_triangleIndex = m_i;
						if (r.m_localShapeInfo == NULL)
							r.m_localShapeInfo = &shapeInfo;

						const btScalar result = m_userCallback->addSingleResult(r, b);
						m_closestHitFraction = m_userCallback->m_closestHitFraction;
						return result;
					}